

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.h
# Opt level: O0

QString * __thiscall QString::left(QString *this,qsizetype n)

{
  ulong uVar1;
  ulong in_RDX;
  QString *in_RSI;
  QString *in_RDI;
  QString *this_00;
  
  this_00 = in_RDI;
  uVar1 = size(in_RSI);
  if (in_RDX < uVar1) {
    first(this_00,(qsizetype)in_RDI);
  }
  else {
    QString(this_00,in_RDI);
  }
  return this_00;
}

Assistant:

[[nodiscard]] QString left(qsizetype n) const &
    {
        if (size_t(n) >= size_t(size()))
            return *this;
        return first(n);
    }